

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotations.cpp
# Opt level: O0

void __thiscall Annotations::GenerateList(Annotations *this)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  ostream *poVar6;
  char *pcVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  long in_RDI;
  char *p;
  Annotation ann;
  int rc;
  char sql [77];
  sqlite3_stmt *stmt;
  Annotation *in_stack_fffffffffffffe50;
  value_type *in_stack_fffffffffffffe58;
  FILE *in_stack_fffffffffffffe60;
  char *local_128;
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [32];
  double local_88;
  double local_80;
  undefined1 local_78;
  int local_6c;
  undefined1 local_68 [88];
  undefined8 local_10 [2];
  
  memcpy(local_68,"SELECT id,side,posx,posy,net,part,pin,note from annotations where visible=1;",
         0x4d);
  local_6c = sqlite3_prepare_v2(*(undefined8 *)(in_RDI + 0x20),local_68,0xffffffff,local_10,0);
  if (local_6c == 0) {
    std::vector<Annotation,_std::allocator<Annotation>_>::clear
              ((vector<Annotation,_std::allocator<Annotation>_> *)0x10e5b6);
    while (local_6c = sqlite3_step(local_10[0]), local_6c == 100) {
      Annotation::Annotation(in_stack_fffffffffffffe50);
      uVar3 = sqlite3_column_int(local_10[0],0);
      uVar4 = sqlite3_column_int(local_10[0],1);
      iVar5 = sqlite3_column_int(local_10[0],2);
      local_88 = (double)iVar5;
      iVar5 = sqlite3_column_int(local_10[0],3);
      local_80 = (double)iVar5;
      local_78 = 0;
      local_128 = (char *)sqlite3_column_text(local_10[0],4);
      if (local_128 == (char *)0x0) {
        local_128 = "";
      }
      std::__cxx11::string::operator=(local_e8,local_128);
      local_128 = (char *)sqlite3_column_text(local_10[0],5);
      if (local_128 == (char *)0x0) {
        local_128 = "";
      }
      std::__cxx11::string::operator=(local_c8,local_128);
      local_128 = (char *)sqlite3_column_text(local_10[0],6);
      if (local_128 == (char *)0x0) {
        local_128 = "";
      }
      std::__cxx11::string::operator=(local_a8,local_128);
      local_128 = (char *)sqlite3_column_text(local_10[0],7);
      if (local_128 == (char *)0x0) {
        local_128 = "";
      }
      std::__cxx11::string::operator=(local_108,local_128);
      dVar2 = local_80;
      dVar1 = local_88;
      if ((*(byte *)(in_RDI + 0x28) & 1) != 0) {
        in_stack_fffffffffffffe60 = _stderr;
        uVar8 = std::__cxx11::string::c_str();
        uVar9 = std::__cxx11::string::c_str();
        uVar10 = std::__cxx11::string::c_str();
        in_stack_fffffffffffffe50 = (Annotation *)std::__cxx11::string::c_str();
        fprintf(in_stack_fffffffffffffe60,"%d(%d:%f,%f) Net:%s Part:%s Pin:%s: Note:%s\nAdded\n",
                dVar1,dVar2,(ulong)uVar3,(ulong)uVar4,uVar8,uVar9,uVar10);
      }
      std::vector<Annotation,_std::allocator<Annotation>_>::push_back
                ((vector<Annotation,_std::allocator<Annotation>_> *)in_stack_fffffffffffffe60,
                 in_stack_fffffffffffffe58);
      Annotation::~Annotation(in_stack_fffffffffffffe50);
    }
    if ((local_6c != 0x65) && ((*(byte *)(in_RDI + 0x28) & 1) != 0)) {
      poVar6 = std::operator<<((ostream *)&std::cerr,"SELECT failed: ");
      pcVar7 = (char *)sqlite3_errmsg(*(undefined8 *)(in_RDI + 0x20));
      poVar6 = std::operator<<(poVar6,pcVar7);
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    }
    sqlite3_finalize(local_10[0]);
  }
  else if ((*(byte *)(in_RDI + 0x28) & 1) != 0) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"SELECT failed: ");
    pcVar7 = (char *)sqlite3_errmsg(*(undefined8 *)(in_RDI + 0x20));
    poVar6 = std::operator<<(poVar6,pcVar7);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void Annotations::GenerateList(void) {
	sqlite3_stmt *stmt;
	char sql[] = "SELECT id,side,posx,posy,net,part,pin,note from annotations where visible=1;";
	int rc;

	rc = sqlite3_prepare_v2(sqldb, sql, -1, &stmt, NULL);
	if (rc != SQLITE_OK) {
		if (debug) std::cerr << "SELECT failed: " << sqlite3_errmsg(sqldb) << std::endl;
		return; // or throw
	}

	annotations.clear();
	while ((rc = sqlite3_step(stmt)) == SQLITE_ROW) {
		Annotation ann;
		ann.id      = sqlite3_column_int(stmt, 0);
		ann.side    = sqlite3_column_int(stmt, 1);
		ann.x       = sqlite3_column_int(stmt, 2);
		ann.y       = sqlite3_column_int(stmt, 3);
		ann.hovered = false;

		const char *p = reinterpret_cast<const char *>(sqlite3_column_text(stmt, 4));
		if (!p) p     = "";
		ann.net       = p;

		p         = reinterpret_cast<const char *>(sqlite3_column_text(stmt, 5));
		if (!p) p = "";
		ann.part  = p;

		p         = reinterpret_cast<const char *>(sqlite3_column_text(stmt, 6));
		if (!p) p = "";
		ann.pin   = p;

		p         = reinterpret_cast<const char *>(sqlite3_column_text(stmt, 7));
		if (!p) p = "";
		ann.note  = p;

		if (debug)
			fprintf(stderr,
			        "%d(%d:%f,%f) Net:%s Part:%s Pin:%s: Note:%s\nAdded\n",
			        ann.id,
			        ann.side,
			        ann.x,
			        ann.y,
			        ann.net.c_str(),
			        ann.part.c_str(),
			        ann.pin.c_str(),
			        ann.note.c_str());

		annotations.push_back(ann);
	}
	if (rc != SQLITE_DONE) {
		if (debug) std::cerr << "SELECT failed: " << sqlite3_errmsg(sqldb) << std::endl;
		// if you return/throw here, don't forget the finalize
	}
	sqlite3_finalize(stmt);
}